

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O3

bool Refal2::CReceptacle::IsValidKeyValue(CUnitList *keyValue)

{
  TUnitType TVar1;
  int iVar2;
  CNodeType *pCVar3;
  
  pCVar3 = (keyValue->super_CNodeList<Refal2::CUnit>).first;
  iVar2 = 0;
  if (pCVar3 != (CNodeType *)0x0) {
    do {
      TVar1 = (pCVar3->super_CUnit).type;
      if (((iVar2 == 0) && ((TVar1 & UT_Char) != 0)) && ((pCVar3->super_CUnit).field_1.c == '=')) {
        iVar2 = 1;
        goto LAB_0012fb0a;
      }
      if ((TVar1 & UT_LeftParen) == 0) {
        if ((TVar1 & UT_RightParen) != 0) {
          if (iVar2 < 1) {
            __assert_fail("depth > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                          ,0x60,
                          "static bool Refal2::CReceptacle::IsValidKeyValue(const CUnitList &)");
          }
          iVar2 = iVar2 + -1;
        }
      }
      else {
        iVar2 = iVar2 + 1;
      }
      pCVar3 = pCVar3->next;
    } while (pCVar3 != (CNode<Refal2::CUnit> *)0x0);
    iVar2 = 0;
  }
LAB_0012fb0a:
  return SUB41(iVar2,0);
}

Assistant:

bool CReceptacle::IsValidKeyValue( const CUnitList& keyValue )
{
	int depth = 0;
	const CUnitNode* node = keyValue.GetFirst();
	while( node != nullptr ) {
		if( depth == 0 && isEqualNode( node ) ) {
			return true;
		}
		if( node->IsLeftParen() ) {
			depth++;
		} else if( node->IsRightParen() ) {
			assert( depth > 0 );
			depth--;
		}
		node = node->Next();
	}
	return false;
}